

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# label_test.cpp
# Opt level: O0

void __thiscall
jhu::thrax::LabelTests_PrintHieroUnary_Test::TestBody(LabelTests_PrintHieroUnary_Test *this)

{
  bool bVar1;
  SpanPair sp;
  reference pvVar2;
  char *message;
  char *in_RCX;
  string_view line;
  AssertHelper local_2f0;
  Message local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  undefined1 local_2c0 [8];
  AssertionResult gtest_ar;
  SpanPair nt;
  NT local_290;
  undefined1 local_278 [8];
  PhrasalRule rule;
  ostringstream local_1e0 [8];
  ostringstream s;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  undefined1 local_58 [8];
  AlignedSentencePair asp;
  LabelTests_PrintHieroUnary_Test *this_local;
  
  asp.alignment.super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_68,"a\tb\t0-0");
  line._M_str = in_RCX;
  line._M_len = (size_t)local_68._M_str;
  readAlignedSentencePair<false,false>
            ((AlignedSentencePair *)local_58,(thrax *)local_68._M_len,line);
  std::__cxx11::ostringstream::ostringstream(local_1e0);
  PhrasalRule::PhrasalRule((PhrasalRule *)local_278,(AlignedSentencePair *)local_58);
  sp = AlignedSentencePair::span((AlignedSentencePair *)local_58);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&nt,"X");
  NT::NT(&local_290,sp,_nt);
  pvVar2 = std::array<jhu::thrax::NT,_4UL>::front((array<jhu::thrax::NT,_4UL> *)local_278);
  (pvVar2->label)._M_str = local_290.label._M_str;
  pvVar2->span = local_290.span;
  (pvVar2->label)._M_len = local_290.label._M_len;
  pvVar2 = std::array<jhu::thrax::NT,_4UL>::front((array<jhu::thrax::NT,_4UL> *)local_278);
  gtest_ar.message_.ptr_ =
       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&pvVar2->span;
  thrax::operator<<((ostream *)local_1e0,(PhrasalRule *)local_278);
  std::__cxx11::ostringstream::str();
  testing::internal::EqHelper<false>::Compare<char[17],std::__cxx11::string>
            ((EqHelper<false> *)local_2c0,"\"[X]\\t[X,1]\\t[X,1]\\t\"","s.str()",
             (char (*) [17])"[X]\t[X,1]\t[X,1]\t",&local_2e0);
  std::__cxx11::string::~string((string *)&local_2e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c0);
  if (!bVar1) {
    testing::Message::Message(&local_2e8);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_2c0);
    testing::internal::AssertHelper::AssertHelper
              (&local_2f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/label_test.cpp"
               ,0x26,message);
    testing::internal::AssertHelper::operator=(&local_2f0,&local_2e8);
    testing::internal::AssertHelper::~AssertHelper(&local_2f0);
    testing::Message::~Message(&local_2e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c0);
  std::__cxx11::ostringstream::~ostringstream(local_1e0);
  AlignedSentencePair::~AlignedSentencePair((AlignedSentencePair *)local_58);
  return;
}

Assistant:

TEST(LabelTests, PrintHieroUnary) {
  auto asp = readAlignedSentencePair<false, false>("a\tb\t0-0");
  std::ostringstream s;
  PhrasalRule rule{asp};
  rule.nts.front() = NT(asp.span(), "X");
  auto nt = rule.nts.front().span;
  s << rule;
  EXPECT_EQ("[X]\t[X,1]\t[X,1]\t", s.str());
}